

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O2

void convertARGBToRGBA64PM_sse4<true>(QRgba64 *buffer,uint *src,int count)

{
  undefined1 auVar1 [16];
  QRgba64 QVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  QRgba64 local_40;
  long local_38;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar1 = _DAT_005f11c0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar5 = 0; lVar5 < count + -3; lVar5 = lVar5 + 4) {
    auVar14 = *(undefined1 (*) [16])(src + lVar5);
    if ((auVar1 & auVar14) == (undefined1  [16])0x0) {
      buffer[lVar5].rgba = 0;
      (buffer + lVar5)[1].rgba = 0;
      buffer[lVar5 + 2].rgba = 0;
      (buffer + lVar5 + 2)[1].rgba = 0;
    }
    else {
      auVar15._0_14_ = auVar14._0_14_;
      auVar15[0xe] = auVar14[7];
      auVar15[0xf] = auVar14[7];
      auVar13._14_2_ = auVar15._14_2_;
      auVar13._0_13_ = auVar14._0_13_;
      auVar13[0xd] = auVar14[6];
      auVar12._13_3_ = auVar13._13_3_;
      auVar12._0_12_ = auVar14._0_12_;
      auVar12[0xc] = auVar14[6];
      auVar11._12_4_ = auVar12._12_4_;
      auVar11._0_11_ = auVar14._0_11_;
      auVar11[0xb] = auVar14[5];
      auVar10._11_5_ = auVar11._11_5_;
      auVar10._0_10_ = auVar14._0_10_;
      auVar10[10] = auVar14[5];
      auVar9._10_6_ = auVar10._10_6_;
      auVar9._0_9_ = auVar14._0_9_;
      auVar9[9] = auVar14[4];
      auVar8._9_7_ = auVar9._9_7_;
      auVar8._0_8_ = auVar14._0_8_;
      auVar8[8] = auVar14[4];
      auVar7._8_8_ = auVar8._8_8_;
      auVar7[7] = auVar14[3];
      auVar7[6] = auVar14[3];
      auVar7[5] = auVar14[2];
      auVar7[4] = auVar14[2];
      auVar7[3] = auVar14[1];
      auVar7[2] = auVar14[1];
      auVar7[1] = auVar14[0];
      auVar7[0] = auVar14[0];
      auVar6[1] = auVar14[8];
      auVar6[0] = auVar14[8];
      auVar6[2] = auVar14[9];
      auVar6[3] = auVar14[9];
      auVar6[4] = auVar14[10];
      auVar6[5] = auVar14[10];
      auVar6[6] = auVar14[0xb];
      auVar6[7] = auVar14[0xb];
      auVar6[8] = auVar14[0xc];
      auVar6[9] = auVar14[0xc];
      auVar6[10] = auVar14[0xd];
      auVar6[0xb] = auVar14[0xd];
      auVar6[0xc] = auVar14[0xe];
      auVar6[0xd] = auVar14[0xe];
      auVar6[0xf] = auVar14[0xf];
      auVar6[0xe] = auVar6[0xf];
      if ((auVar1 & ~auVar14) == (undefined1  [16])0x0) {
        *(undefined1 (*) [16])(buffer + lVar5) = auVar7;
        *(undefined1 (*) [16])(buffer + lVar5 + 2) = auVar6;
      }
      else {
        auVar14 = pshuflw(in_XMM4,auVar7,0xff);
        auVar14 = pshufhw(auVar14,auVar14,0xff);
        auVar14 = pmulhuw(auVar14,auVar7);
        auVar15 = pshuflw(in_XMM5,auVar6,0xff);
        auVar15 = pshufhw(auVar15,auVar15,0xff);
        in_XMM5 = pmulhuw(auVar15,auVar6);
        auVar16._0_2_ = auVar14._0_2_ - (auVar14._0_2_ >> 0xf);
        auVar16._2_2_ = auVar14._2_2_ - (auVar14._2_2_ >> 0xf);
        auVar16._4_2_ = auVar14._4_2_ - (auVar14._4_2_ >> 0xf);
        auVar16._6_2_ = auVar14._6_2_ - (auVar14._6_2_ >> 0xf);
        auVar16._8_2_ = auVar14._8_2_ - (auVar14._8_2_ >> 0xf);
        auVar16._10_2_ = auVar14._10_2_ - (auVar14._10_2_ >> 0xf);
        auVar16._12_2_ = auVar14._12_2_ - (auVar14._12_2_ >> 0xf);
        auVar16._14_2_ = auVar14._14_2_ - (auVar14._14_2_ >> 0xf);
        auVar14._0_2_ = in_XMM5._0_2_ - (in_XMM5._0_2_ >> 0xf);
        auVar14._2_2_ = in_XMM5._2_2_ - (in_XMM5._2_2_ >> 0xf);
        auVar14._4_2_ = in_XMM5._4_2_ - (in_XMM5._4_2_ >> 0xf);
        auVar14._6_2_ = in_XMM5._6_2_ - (in_XMM5._6_2_ >> 0xf);
        auVar14._8_2_ = in_XMM5._8_2_ - (in_XMM5._8_2_ >> 0xf);
        auVar14._10_2_ = in_XMM5._10_2_ - (in_XMM5._10_2_ >> 0xf);
        auVar14._12_2_ = in_XMM5._12_2_ - (in_XMM5._12_2_ >> 0xf);
        auVar14._14_2_ = in_XMM5._14_2_ - (in_XMM5._14_2_ >> 0xf);
        auVar15 = pblendw(auVar16,auVar7,0x88);
        in_XMM4 = pblendw(auVar14,auVar6,0x88);
        *(undefined1 (*) [16])(buffer + lVar5) = auVar15;
        *(undefined1 (*) [16])(buffer + lVar5 + 2) = in_XMM4;
      }
    }
  }
  uVar3 = 0;
  for (; (uVar3 < 3 && (lVar5 < count)); lVar5 = lVar5 + 1) {
    uVar4 = src[lVar5] & 0xff00ff;
    local_40 = QRgba64::fromArgb32(uVar4 >> 0x10 | uVar4 << 0x10 | src[lVar5] & 0xff00ff00);
    QVar2 = QRgba64::premultiplied(&local_40);
    buffer[lVar5].rgba = QVar2.rgba;
    uVar3 = uVar3 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void convertARGBToRGBA64PM_sse4(QRgba64 *buffer, const uint *src, int count)
{
    int i = 0;
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i rgbaMask = _mm_setr_epi8(2, 1, 0, 3, 6, 5, 4, 7, 10, 9, 8, 11, 14, 13, 12, 15);
    const __m128i shuffleMask = _mm_setr_epi8(6, 7, 6, 7, 6, 7, 6, 7, 14, 15, 14, 15, 14, 15, 14, 15);
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[i]);
        if (!_mm_testz_si128(srcVector, alphaMask)) {
            bool cf = _mm_testc_si128(srcVector, alphaMask);

            if (!RGBA)
                srcVector = _mm_shuffle_epi8(srcVector, rgbaMask);
            const __m128i src1 = _mm_unpacklo_epi8(srcVector, srcVector);
            const __m128i src2 = _mm_unpackhi_epi8(srcVector, srcVector);
            if (!cf) {
                __m128i alpha1 = _mm_shuffle_epi8(src1, shuffleMask);
                __m128i alpha2 = _mm_shuffle_epi8(src2, shuffleMask);
                __m128i dst1 = _mm_mulhi_epu16(src1, alpha1);
                __m128i dst2 = _mm_mulhi_epu16(src2, alpha2);
                // Map 0->0xfffe to 0->0xffff
                dst1 = _mm_add_epi16(dst1, _mm_srli_epi16(dst1, 15));
                dst2 = _mm_add_epi16(dst2, _mm_srli_epi16(dst2, 15));
                // correct alpha value:
                dst1 = _mm_blend_epi16(dst1, src1, 0x88);
                dst2 = _mm_blend_epi16(dst2, src2, 0x88);
                _mm_storeu_si128((__m128i *)&buffer[i], dst1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], dst2);
            } else {
                _mm_storeu_si128((__m128i *)&buffer[i], src1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], src2);
            }
        } else {
            _mm_storeu_si128((__m128i *)&buffer[i], zero);
            _mm_storeu_si128((__m128i *)&buffer[i + 2], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        const uint s = RGBA ? RGBA2ARGB(src[i]) : src[i];
        buffer[i] = QRgba64::fromArgb32(s).premultiplied();
    }
}